

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall ExternalTester::testAllWavelet(ExternalTester *this)

{
  pointer *this_00;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  _Setw _Var5;
  int iVar6;
  ostream *poVar7;
  double *pdVar8;
  reference pvVar9;
  reference pvVar10;
  void *pvVar11;
  TypeOneDRule rule;
  vector<double,_std::allocator<double>_> *pvVar12;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_284;
  int local_280;
  int i_3;
  int j_1;
  int i_2;
  vector<double,_std::allocator<double>_> local_268;
  allocator<double> local_241;
  undefined1 local_240 [8];
  vector<double,_std::allocator<double>_> v;
  int i_1;
  int j;
  int i;
  vector<double,_std::allocator<double>_> y;
  double *coeff;
  vector<double,_std::allocator<double>_> local_1e8;
  undefined1 local_1c8 [8];
  vector<double,_std::allocator<double>_> pnts;
  vector<double,_std::allocator<double>_> vals;
  vector<int,_std::allocator<int>_> pntr;
  vector<int,_std::allocator<int>_> indx;
  TasmanianSparseGrid grid;
  string local_d8;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int wthird;
  int wsecond;
  int wfirst;
  double tols1 [10];
  int depths1 [10];
  bool local_11;
  bool pass;
  ExternalTester *this_local;
  
  local_11 = true;
  memcpy(tols1 + 9,&DAT_00180cf0,0x28);
  memcpy(&wsecond,&DAT_00180d20,0x50);
  wthird = 0xb;
  local_a0 = 0x22;
  local_a4 = 0xf;
  bVar4 = testLocalWaveletRule
                    (this,&(this->f21nx2).super_BaseFunction,(int *)(tols1 + 9),(double *)&wsecond,
                     true);
  if ((bVar4) &&
     (bVar4 = testLocalWaveletRule
                        (this,&(this->f21nx2).super_BaseFunction,(int *)(tols1 + 9),
                         (double *)&wsecond,false), bVar4)) {
    local_a8 = (int)std::setw(wthird);
    poVar7 = std::operator<<((ostream *)&std::cout,(_Setw)local_a8);
    poVar7 = std::operator<<(poVar7,"Rules");
    local_ac = (int)std::setw(local_a0);
    poVar7 = std::operator<<(poVar7,(_Setw)local_ac);
    poVar7 = std::operator<<(poVar7,"wavelet");
    local_b0 = (int)std::setw(local_a4);
    poVar7 = std::operator<<(poVar7,(_Setw)local_b0);
    poVar7 = std::operator<<(poVar7,"Pass");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_b4 = (int)std::setw(wthird);
    poVar7 = std::operator<<((ostream *)&std::cout,(_Setw)local_b4);
    poVar7 = std::operator<<(poVar7,"Rule");
    local_b8 = (int)std::setw(local_a0);
    poVar7 = std::operator<<(poVar7,(_Setw)local_b8);
    TasGrid::IO::getRuleString_abi_cxx11_(&local_d8,(IO *)0x29,rule);
    poVar7 = std::operator<<(poVar7,(string *)&local_d8);
    _Var5 = std::setw(local_a4);
    poVar7 = std::operator<<(poVar7,_Var5);
    poVar7 = std::operator<<(poVar7,"FAIL");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_d8);
    local_11 = false;
  }
  this_00 = &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage;
  TasGrid::TasmanianSparseGrid::TasmanianSparseGrid((TasmanianSparseGrid *)this_00);
  TasGrid::TasmanianSparseGrid::makeWaveletGrid((int)this_00,2,1,2,(int *)0x1);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  genRandom((vector<double,_std::allocator<double>_> *)local_1c8,10,2);
  TasGrid::TasmanianSparseGrid::evaluateSparseHierarchicalFunctions
            ((vector *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector *)local_1c8,
             (vector *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_1e8);
  getError(this,&(this->f21nx2).super_BaseFunction,
           (TasmanianSparseGrid *)
           &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,type_internal_interpolation,&local_1e8);
  std::vector<double,_std::allocator<double>_>::~vector(&local_1e8);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  std::allocator<double>::allocator((allocator<double> *)((long)&j + 3));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,10,(allocator<double> *)((long)&j + 3));
  std::allocator<double>::~allocator((allocator<double> *)((long)&j + 3));
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_1c8);
  std::vector<double,_std::allocator<double>_>::data((vector<double,_std::allocator<double>_> *)&i);
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(int)pdVar8,(double *)0xa);
  for (i_1 = 0; i_1 < 10; i_1 = i_1 + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,(long)i_1);
    for (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ = *pvVar9;
        iVar6 = v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage,(long)(i_1 + 1)),
        pdVar3 = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, iVar6 < *pvVar9;
        v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                          (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar1 = pdVar3[*pvVar9];
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,
                           (long)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage._4_4_);
      dVar2 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i,(long)i_1);
      *pvVar10 = -dVar1 * dVar2 + *pvVar10;
    }
  }
  for (v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage._0_4_ = 0;
      (int)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage < 10;
      v.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           (int)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    pvVar12 = (vector<double,_std::allocator<double>_> *)&i;
    std::vector<double,_std::allocator<double>_>::operator[]
              (pvVar12,(long)(int)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage);
    std::abs((int)pvVar12);
    if (1e-12 < extraout_XMM0_Qa) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Error in evaluateSparseHierarchicalFunctions() (wavelet)");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i,
                           (long)(int)v.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      pvVar11 = (void *)std::ostream::operator<<(&std::cout,*pvVar10);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      local_11 = false;
    }
  }
  iVar6 = TasGrid::TasmanianSparseGrid::getNumPoints
                    ((TasmanianSparseGrid *)
                     &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  std::allocator<double>::allocator(&local_241);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_240,(long)(iVar6 * 10),&local_241);
  std::allocator<double>::~allocator(&local_241);
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector(&local_268);
  getError(this,&(this->f21nx2).super_BaseFunction,
           (TasmanianSparseGrid *)
           &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage,type_internal_interpolation,&local_268);
  std::vector<double,_std::allocator<double>_>::~vector(&local_268);
  TasGrid::TasmanianSparseGrid::evaluateHierarchicalFunctions
            ((vector *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector *)local_1c8);
  y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)TasGrid::TasmanianSparseGrid::getHierarchicalCoefficients();
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_1c8);
  std::vector<double,_std::allocator<double>_>::data((vector<double,_std::allocator<double>_> *)&i);
  TasGrid::TasmanianSparseGrid::evaluateBatch
            ((double *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(int)pdVar8,(double *)0xa);
  for (i_3 = 0; i_3 < 10; i_3 = i_3 + 1) {
    for (local_280 = 0;
        iVar6 = TasGrid::TasmanianSparseGrid::getNumPoints
                          ((TasmanianSparseGrid *)
                           &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage), local_280 < iVar6;
        local_280 = local_280 + 1) {
      dVar1 = y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage[local_280];
      iVar6 = TasGrid::TasmanianSparseGrid::getNumPoints
                        ((TasmanianSparseGrid *)
                         &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)local_240,
                           (long)(i_3 * iVar6 + local_280));
      dVar2 = *pvVar10;
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i,(long)i_3);
      *pvVar10 = -dVar1 * dVar2 + *pvVar10;
    }
  }
  for (local_284 = 0; local_284 < 10; local_284 = local_284 + 1) {
    pvVar12 = (vector<double,_std::allocator<double>_> *)&i;
    std::vector<double,_std::allocator<double>_>::operator[](pvVar12,(long)local_284);
    std::abs((int)pvVar12);
    if (1e-12 < extraout_XMM0_Qa_00) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "Error in getHierarchicalCoefficients() (wavelet)");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)&i,(long)local_284);
      pvVar11 = (void *)std::ostream::operator<<(&std::cout,*pvVar10);
      std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
      local_11 = false;
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_240);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_1c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &pnts.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &pntr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  TasGrid::TasmanianSparseGrid::~TasmanianSparseGrid
            ((TasmanianSparseGrid *)
             &indx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return local_11;
}

Assistant:

bool ExternalTester::testAllWavelet() const{
    bool pass = true;
    // Depths and tolerances for quadrature (column 1), interpolation (columns 2-3), and differentiation (columns 4-5).
    const int depths1[10] = { 7, 7, 7, 7, 7, // order 1
                              5, 5, 5, 5, 5 }; // order 3
    const double tols1[10] = { 5.E-05, 1.E-04, 1.E-04, 5E-02, 5E-02, // order 1
                               1.E-08, 1.E-07, 1.E-07, 5E-05, 5E-05 }; // order 3
    int wfirst = 11, wsecond = 34, wthird = 15;
    if (testLocalWaveletRule(&f21nx2, depths1, tols1, true) and testLocalWaveletRule(&f21nx2, depths1, tols1, false)){
        cout << setw(wfirst) << "Rules" << setw(wsecond) << "wavelet" << setw(wthird) << "Pass" << endl;
    }else{
        cout << setw(wfirst) << "Rule" << setw(wsecond) << IO::getRuleString(rule_wavelet) << setw(wthird) << "FAIL" << endl; pass = false;
    }{ TasGrid::TasmanianSparseGrid grid;
        grid.makeWaveletGrid(2, 1, 2, 1);
        std::vector<int> indx, pntr;
        std::vector<double> vals;
        std::vector<double> pnts = genRandom(10, 2);
        grid.evaluateSparseHierarchicalFunctions(pnts, pntr, indx, vals);
        getError(&f21nx2, grid, type_internal_interpolation); // this is done to load the values
        const double *coeff = grid.getHierarchicalCoefficients();
        std::vector<double> y(10);
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++){
                y[i] -= coeff[indx[j]] * vals[j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in evaluateSparseHierarchicalFunctions() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
        std::vector<double> v(10 * grid.getNumPoints());
        getError(&f21nx2, grid, type_internal_interpolation);
        grid.evaluateHierarchicalFunctions(pnts, v);
        coeff = grid.getHierarchicalCoefficients();
        grid.evaluateBatch(pnts.data(), 10, y.data());
        for(int i=0; i<10; i++){
            for(int j=0; j<grid.getNumPoints(); j++){
                y[i] -= coeff[j] * v[i*grid.getNumPoints() + j];
            }
        }
        for(int i=0; i<10; i++){
            if (std::abs(y[i]) > Maths::num_tol){
                cout << "Error in getHierarchicalCoefficients() (wavelet)" << endl;
                cout << y[i] << endl;
                pass = false;
            }
        }
    }
    return pass;
}